

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O3

void print_bgparam(int bg,bg_referencepoint_container_t x,bg_referencepoint_container_t y,
                  bg_rotation_scaling_t pa,bg_rotation_scaling_t pb,bg_rotation_scaling_t pc,
                  bg_rotation_scaling_t pd)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = x._1_4_ & 0x7ffff;
  uVar8 = -uVar1;
  if ((x.initial.raw >> 0x1b & 1) == 0) {
    uVar8 = uVar1;
  }
  uVar2 = y._1_4_ & 0x7ffff;
  uVar1 = -uVar2;
  if ((y.initial.raw >> 0x1b & 1) == 0) {
    uVar1 = uVar2;
  }
  uVar9 = x.current.raw >> 8 & 0x7ffff;
  uVar2 = -uVar9;
  if ((x.current.raw >> 0x1b & 1) == 0) {
    uVar2 = uVar9;
  }
  uVar6 = y.current.raw >> 8 & 0x7ffff;
  uVar9 = -uVar6;
  if ((y.current.raw >> 0x1b & 1) == 0) {
    uVar9 = uVar6;
  }
  uVar7 = (uint)pa >> 8 & 0x7f;
  uVar6 = -uVar7;
  if (-1 < pa.sraw) {
    uVar6 = uVar7;
  }
  uVar3 = (uint)pb >> 8 & 0x7f;
  uVar7 = -uVar3;
  if (-1 < pb.sraw) {
    uVar7 = uVar3;
  }
  uVar4 = (uint)pc >> 8 & 0x7f;
  uVar3 = -uVar4;
  if (-1 < pc.sraw) {
    uVar3 = uVar4;
  }
  uVar5 = (uint)pd >> 8 & 0x7f;
  uVar4 = -uVar5;
  if (-1 < pd.sraw) {
    uVar4 = uVar5;
  }
  DUI_Print("BG%d - Initial X: %f Y: %f Current: X: %f Y: %f | PA: %f PB: %f PC: %f PD: %f",
            (double)(int)uVar8,(double)(int)uVar1,(double)(int)uVar2,(double)(int)uVar9,
            (double)(int)uVar6,(double)(int)uVar7,(double)(int)uVar3,(double)(int)uVar4,bg);
  _duiCursor.y = _duiCursor.y + _duiStyle.LineHeight;
  _duiCursor.x = _duiLineStart;
  return;
}

Assistant:

void print_bgparam(int bg, bg_referencepoint_container_t x, bg_referencepoint_container_t y, bg_rotation_scaling_t pa, bg_rotation_scaling_t pb, bg_rotation_scaling_t pc, bg_rotation_scaling_t pd) {
    DUI_Println("BG%d - Initial X: %f Y: %f Current: X: %f Y: %f | PA: %f PB: %f PC: %f PD: %f", bg,
            REF_TO_DOUBLE(x.initial),
            REF_TO_DOUBLE(y.initial),
            REF_TO_DOUBLE(x.current),
            REF_TO_DOUBLE(y.current),
            ROTSCALE_TO_DOUBLE(&pa),
            ROTSCALE_TO_DOUBLE(&pb),
            ROTSCALE_TO_DOUBLE(&pc),
            ROTSCALE_TO_DOUBLE(&pd));
}